

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.cpp
# Opt level: O1

int __thiscall
chrono::geometry::ChTriangleMeshConnected::RepairDuplicateVertexes
          (ChTriangleMeshConnected *this,double tolerance)

{
  pointer pCVar1;
  double dVar2;
  pointer pCVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  double *pdVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> processed_verts;
  vector<int,_std::allocator<int>_> new_indexes;
  allocator_type local_69;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> local_68;
  double local_48;
  vector<int,_std::allocator<int>_> local_40;
  
  local_68.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = tolerance;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_40,
             ((long)(this->m_vertices).
                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_vertices).
                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,&local_69)
  ;
  pCVar3 = (this->m_vertices).
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_vertices).
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish == pCVar3) {
    iVar7 = 0;
  }
  else {
    uVar10 = 0;
    iVar7 = 0;
    dVar18 = local_48;
    do {
      bVar11 = (long)local_68.
                     super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_68.
                     super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start != 0;
      if (bVar11) {
        uVar6 = ((long)local_68.
                       super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_68.
                       super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        dVar2 = pCVar3[uVar10].m_data[1] -
                (local_68.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_data[1];
        auVar12._8_8_ = 0;
        auVar12._0_8_ =
             pCVar3[uVar10].m_data[0] -
             (local_68.
              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->m_data[0];
        auVar14._8_8_ = 0;
        auVar14._0_8_ = dVar2 * dVar2;
        auVar12 = vfmadd231sd_fma(auVar14,auVar12,auVar12);
        auVar16._8_8_ = 0;
        auVar16._0_8_ =
             pCVar3[uVar10].m_data[2] -
             (local_68.
              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->m_data[2];
        auVar12 = vfmadd231sd_fma(auVar12,auVar16,auVar16);
        uVar9 = 0;
        if (dVar18 <= auVar12._0_8_) {
          pdVar8 = local_68.
                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1].m_data + 2;
          uVar9 = 0;
          do {
            if ((uVar6 + (uVar6 == 0)) - 1 == uVar9) {
              bVar11 = uVar9 + 1 <= uVar6 && uVar6 - (uVar9 + 1) != 0;
              goto LAB_0082784d;
            }
            dVar2 = pCVar3[uVar10].m_data[1] - pdVar8[-1];
            auVar13._8_8_ = 0;
            auVar13._0_8_ =
                 pCVar3[uVar10].m_data[0] - ((ChVector<double> *)(pdVar8 + -2))->m_data[0];
            auVar15._8_8_ = 0;
            auVar15._0_8_ = dVar2 * dVar2;
            auVar12 = vfmadd231sd_fma(auVar15,auVar13,auVar13);
            auVar17._8_8_ = 0;
            auVar17._0_8_ = pCVar3[uVar10].m_data[2] - *pdVar8;
            auVar12 = vfmadd231sd_fma(auVar12,auVar17,auVar17);
            pdVar8 = pdVar8 + 3;
            uVar9 = uVar9 + 1;
          } while (dVar18 <= auVar12._0_8_);
          bVar11 = uVar9 <= uVar6 && uVar6 - uVar9 != 0;
        }
        iVar7 = iVar7 + 1;
        local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar10] = (int)uVar9;
      }
LAB_0082784d:
      if (!bVar11) {
        std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
                  (&local_68,pCVar3 + uVar10);
        local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar10] =
             (int)((ulong)((long)local_68.
                                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_68.
                                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555 + -1;
        dVar18 = local_48;
      }
      uVar10 = uVar10 + 1;
      pCVar3 = (this->m_vertices).
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = ((long)(this->m_vertices).
                     super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3 >> 3) *
              -0x5555555555555555;
    } while (uVar10 <= uVar6 && uVar6 - uVar10 != 0);
  }
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::operator=
            (&this->m_vertices,&local_68);
  pCVar1 = (this->m_face_v_indices).
           super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->m_face_v_indices).
                super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pCVar1;
  if (lVar5 != 0) {
    lVar5 = (lVar5 >> 2) * -0x5555555555555555;
    lVar5 = lVar5 + (ulong)(lVar5 == 0);
    piVar4 = pCVar1->m_data + 2;
    do {
      ((ChVector<int> *)(piVar4 + -2))->m_data[0] =
           local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[((ChVector<int> *)(piVar4 + -2))->m_data[0]];
      piVar4[-1] = local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[piVar4[-1]];
      *piVar4 = local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[*piVar4];
      piVar4 = piVar4 + 3;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar7;
}

Assistant:

int ChTriangleMeshConnected::RepairDuplicateVertexes(const double tolerance) {
    int nmerged = 0;
    std::vector<ChVector<>> processed_verts;
    std::vector<int> new_indexes(m_vertices.size());

    // merge vertexes
    for (int i = 0; i < m_vertices.size(); ++i) {
        bool tomerge = false;
        for (int j = 0; j < processed_verts.size(); ++j) {
            if ((m_vertices[i] - processed_verts[j]).Length2() < tolerance) {
                tomerge = true;
                ++nmerged;
                new_indexes[i] = j;
                break;
            }
        }
        if (!tomerge) {
            processed_verts.push_back(m_vertices[i]);
            new_indexes[i] = (int)processed_verts.size() - 1;
        }
    }

    m_vertices = processed_verts;

    // Update the merged vertexes also in face indexes to vertexes
    // Note: we DO NOT update the normal, color, UV, or material indices!
    for (int i = 0; i < this->m_face_v_indices.size(); ++i) {
        m_face_v_indices[i].x() = new_indexes[m_face_v_indices[i].x()];
        m_face_v_indices[i].y() = new_indexes[m_face_v_indices[i].y()];
        m_face_v_indices[i].z() = new_indexes[m_face_v_indices[i].z()];
    }

    return nmerged;
}